

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_node **ppsVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  stbrp_context *psVar6;
  uint uVar7;
  int iVar8;
  int extraout_EAX;
  long extraout_RAX;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  stbrp_node *psVar12;
  stbrp_node *psVar13;
  stbrp_context *psVar14;
  uint uVar15;
  stbrp_node *in_R8;
  stbrp_node *psVar16;
  stbrp_rect *psVar17;
  stbrp_node *psVar18;
  size_t __nmemb;
  stbrp_context *psVar19;
  size_t sVar20;
  int iVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int waste;
  uint local_8c;
  uint local_88;
  int local_84;
  int local_70;
  int local_6c;
  stbrp_node *local_68;
  stbrp_context *local_60;
  ulong local_58;
  size_t local_50;
  stbrp_rect *local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  auVar5 = _DAT_0065b2a0;
  __nmemb = (size_t)(uint)num_rects;
  if (num_rects < 1) {
    __nmemb = (size_t)num_rects;
    qsort(rects,__nmemb,0x10,rect_height_compare);
  }
  else {
    lVar9 = __nmemb - 1;
    auVar23._8_4_ = (int)lVar9;
    auVar23._0_8_ = lVar9;
    auVar23._12_4_ = (int)((ulong)lVar9 >> 0x20);
    piVar10 = &rects[1].was_packed;
    uVar11 = 0;
    auVar23 = auVar23 ^ _DAT_0065b2a0;
    auVar24 = _DAT_0065b290;
    do {
      auVar25 = auVar24 ^ auVar5;
      if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                  auVar23._4_4_ < auVar25._4_4_) & 1)) {
        piVar10[-4] = (int)uVar11;
      }
      if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
          auVar25._12_4_ <= auVar23._12_4_) {
        *piVar10 = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar9 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar9 + 2;
      piVar10 = piVar10 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar11);
    qsort(rects,__nmemb,0x10,rect_height_compare);
    if (0 < num_rects) {
      ppsVar1 = &context->active_head;
      sVar20 = 0;
      local_60 = context;
      local_58 = __nmemb;
      local_50 = __nmemb;
      local_48 = rects;
      do {
        psVar17 = rects + sVar20;
        uVar2 = rects[sVar20].w;
        if ((uVar2 == 0) || (uVar3 = psVar17->h, uVar3 == 0)) {
          psVar17->x = 0;
          psVar17->y = 0;
        }
        else {
          iVar8 = context->align;
          iVar21 = (uint)uVar2 + iVar8 + -1;
          uVar22 = iVar21 - iVar21 % iVar8;
          if ((int)uVar22 % iVar8 != 0) {
            __assert_fail("width % c->align == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imstb_rectpack.h"
                          ,0x168,
                          "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                         );
          }
          if (((int)uVar22 <= context->width) && ((int)(uint)uVar3 <= context->height)) {
            uVar4 = *(ushort *)&((stbrp_context *)*ppsVar1)->width;
            local_40 = (ulong)uVar2;
            local_38 = psVar17;
            if (context->width < (int)(uVar22 + uVar4)) {
              iVar8 = context->heuristic;
              psVar18 = (stbrp_node *)0x0;
              local_8c = 0x40000000;
              local_84 = 0x40000000;
              local_88 = 0;
            }
            else {
              local_8c = 0x40000000;
              psVar18 = (stbrp_node *)0x0;
              local_84 = 0x40000000;
              psVar13 = (stbrp_node *)ppsVar1;
              psVar19 = (stbrp_context *)*ppsVar1;
              do {
                uVar15 = stbrp__skyline_find_min_y
                                   (psVar19,(stbrp_node *)(ulong)uVar4,uVar22,(int)&local_6c,
                                    (int *)in_R8);
                iVar8 = context->heuristic;
                if (iVar8 == 0) {
                  if ((int)uVar15 < (int)local_8c) {
                    psVar18 = psVar13;
                    local_8c = uVar15;
                  }
                }
                else if (((int)(uVar3 + uVar15) <= context->height) &&
                        (((int)uVar15 < (int)local_8c || (local_6c < local_84 && uVar15 == local_8c)
                         ))) {
                  local_84 = local_6c;
                  psVar18 = psVar13;
                  local_8c = uVar15;
                }
                psVar13 = (stbrp_node *)&psVar19->align;
                uVar4 = (ushort)(*(stbrp_context **)&psVar19->align)->width;
                psVar19 = *(stbrp_context **)&psVar19->align;
              } while ((int)(uVar22 + uVar4) <= context->width);
              if (psVar18 == (stbrp_node *)0x0) {
                psVar18 = (stbrp_node *)0x0;
                local_88 = 0;
              }
              else {
                local_88 = (uint)**(ushort **)psVar18;
              }
            }
            local_68 = psVar18;
            if (iVar8 == 1) {
              psVar19 = (stbrp_context *)*ppsVar1;
              psVar14 = psVar19;
              psVar13 = (stbrp_node *)ppsVar1;
              if ((int)(uint)(ushort)psVar19->width < (int)uVar22) {
                do {
                  psVar14 = *(stbrp_context **)&psVar14->align;
                } while ((ushort)psVar14->width < uVar22);
              }
              do {
                uVar15 = (ushort)psVar14->width - uVar22;
                psVar6 = psVar19;
                if ((int)uVar15 < 0) {
                  __assert_fail("xpos >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imstb_rectpack.h"
                                ,0x1a8,
                                "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                               );
                }
                do {
                  psVar19 = psVar6;
                  psVar18 = psVar13;
                  psVar13 = (stbrp_node *)&psVar19->align;
                  psVar6 = *(stbrp_context **)&psVar19->align;
                } while ((ushort)(*(stbrp_context **)&psVar19->align)->width <= uVar15);
                if (uVar15 < (ushort)psVar19->width) {
                  __assert_fail("node->next->x > xpos && node->x <= xpos",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imstb_rectpack.h"
                                ,0x1ae,
                                "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                               );
                }
                uVar7 = stbrp__skyline_find_min_y
                                  (psVar19,(stbrp_node *)(ulong)uVar15,uVar22,(int)&local_70,
                                   (int *)in_R8);
                if ((((int)(uVar3 + uVar7) <= local_60->height) && ((int)uVar7 <= (int)local_8c)) &&
                   (((uVar7 < local_8c || (local_70 < local_84)) ||
                    ((local_70 == local_84 && ((int)uVar15 < (int)local_88)))))) {
                  local_84 = local_70;
                  local_8c = uVar7;
                  local_88 = uVar15;
                  local_68 = psVar18;
                }
                piVar10 = &psVar14->align;
                psVar14 = *(stbrp_context **)piVar10;
                psVar13 = psVar18;
              } while (*(stbrp_context **)piVar10 != (stbrp_context *)0x0);
            }
            rects = local_48;
            context = local_60;
            in_R8 = local_68;
            psVar17 = local_38;
            __nmemb = local_50;
            if (((local_68 != (stbrp_node *)0x0) &&
                (iVar8 = uVar3 + local_8c, iVar8 <= local_60->height)) &&
               (psVar13 = local_60->free_head, psVar13 != (stbrp_node *)0x0)) {
              psVar13->x = (stbrp_coord)local_88;
              psVar13->y = (stbrp_coord)iVar8;
              local_60->free_head = psVar13->next;
              psVar18 = *(stbrp_node **)local_68;
              psVar12 = psVar18;
              psVar16 = local_68;
              if ((int)(uint)psVar18->x < (int)local_88) {
                psVar12 = psVar18->next;
                psVar16 = (stbrp_node *)&psVar18->next;
              }
              *(stbrp_node **)psVar16 = psVar13;
              in_R8 = psVar12->next;
              iVar8 = local_88 + (int)local_40;
              if (in_R8 != (stbrp_node *)0x0) {
                do {
                  psVar18 = in_R8;
                  in_R8 = (stbrp_node *)(ulong)psVar18->x;
                  if (iVar8 < (int)(uint)psVar18->x) goto LAB_00302fc6;
                  psVar12->next = local_60->free_head;
                  local_60->free_head = psVar12;
                  psVar12 = psVar18;
                  in_R8 = psVar18->next;
                } while (psVar18->next != (stbrp_node *)0x0);
                in_R8 = (stbrp_node *)0x0;
              }
LAB_00302fc6:
              psVar13->next = psVar12;
              if ((int)(uint)psVar12->x < iVar8) {
                psVar12->x = (stbrp_coord)iVar8;
              }
              local_38->x = (stbrp_coord)local_88;
              local_38->y = (stbrp_coord)local_8c;
              goto LAB_00302fb5;
            }
          }
          psVar17->x = 0xffff;
          psVar17->y = 0xffff;
        }
LAB_00302fb5:
        sVar20 = sVar20 + 1;
        if (sVar20 == __nmemb) {
          qsort(rects,__nmemb,0x10,rect_original_order);
          lVar9 = extraout_RAX;
          if (0 < (int)local_58) {
            lVar9 = 0;
            do {
              uVar22 = 1;
              if (*(short *)((long)&rects->x + lVar9) == -1) {
                uVar22 = (uint)(*(short *)((long)&rects->y + lVar9) != -1);
              }
              *(uint *)((long)&rects->was_packed + lVar9) = uVar22;
              lVar9 = lVar9 + 0x10;
            } while (__nmemb * 0x10 != lVar9);
          }
          return (int)lVar9;
        }
      } while( true );
    }
  }
  qsort(rects,__nmemb,0x10,rect_original_order);
  return extraout_EAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}